

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::rebalance(Patch *this)

{
  Node *pivot;
  Node *root;
  ulong uVar1;
  uint32_t uVar2;
  Node *root_parent;
  uint uVar3;
  ulong uVar4;
  __type_conflict __x;
  double dVar5;
  
  if (this->root != (Node *)0x0) {
    pivot = this->root;
    root_parent = (Node *)0x0;
    while (root = pivot, root != (Node *)0x0) {
      pivot = root->left;
      if (pivot == (Node *)0x0) {
        pivot = root->right;
        root_parent = root;
      }
      else {
        rotate_node_right(this,pivot,root,root_parent);
      }
    }
    uVar2 = this->change_count;
    __x = std::log2<unsigned_int>(uVar2 + 1);
    dVar5 = floor(__x);
    dVar5 = exp2(dVar5);
    uVar4 = (ulong)(dVar5 + -1.0);
    uVar2 = uVar2 - (int)uVar4;
    uVar1 = uVar4 & 0xffffffff;
    do {
      perform_rebalancing_rotations(this,uVar2);
      uVar1 = uVar1 >> 1;
      uVar2 = (uint32_t)uVar1;
      uVar3 = (uint)uVar4;
      uVar4 = uVar1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void Patch::rebalance() {
  if (!root)
    return;

  // Transform tree to vine
  Node *pseudo_root = root, *pseudo_root_parent = nullptr;
  while (pseudo_root) {
    Node *left = pseudo_root->left;
    Node *right = pseudo_root->right;
    if (left) {
      rotate_node_right(left, pseudo_root, pseudo_root_parent);
      pseudo_root = left;
    } else {
      pseudo_root_parent = pseudo_root;
      pseudo_root = right;
    }
  }

  // Transform vine to balanced tree
  uint32_t n = change_count;
  uint32_t m = std::pow(2, std::floor(std::log2(n + 1))) - 1;
  perform_rebalancing_rotations(n - m);
  while (m > 1) {
    m = m / 2;
    perform_rebalancing_rotations(m);
  }
}